

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O3

HighsInt __thiscall
HighsSimplexAnalysis::simplexTimerNumCall
          (HighsSimplexAnalysis *this,HighsInt simplex_clock,HighsInt thread_id)

{
  pointer pHVar1;
  HighsInt HVar2;
  
  HVar2 = -1;
  if (this->analyse_simplex_time == true) {
    pHVar1 = (this->thread_simplex_clocks).
             super__Vector_base<HighsTimerClock,_std::allocator<HighsTimerClock>_>._M_impl.
             super__Vector_impl_data._M_start;
    HVar2 = *(HighsInt *)
             (*(long *)&((pHVar1[thread_id].timer_pointer_)->clock_num_call).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl +
             (long)*(int *)(*(long *)&pHVar1[thread_id].clock_.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl +
                           (long)simplex_clock * 4) * 4);
  }
  return HVar2;
}

Assistant:

HighsInt HighsSimplexAnalysis::simplexTimerNumCall(const HighsInt simplex_clock,
                                                   const HighsInt thread_id) {
  if (!analyse_simplex_time) return -1;
  // assert(analyse_simplex_time);
  return thread_simplex_clocks[thread_id]
      .timer_pointer_
      ->clock_num_call[thread_simplex_clocks[thread_id].clock_[simplex_clock]];
}